

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read.c
# Opt level: O0

int archive_read_open1(archive *_a)

{
  long lVar1;
  char *pcVar2;
  int iVar3;
  void *pvVar4;
  int local_38;
  int magic_test;
  int e;
  int slot;
  archive_read_filter *tmp;
  archive_read_filter *filter;
  archive_read *a;
  archive *_a_local;
  
  local_38 = 0;
  iVar3 = __archive_check_magic(_a,0xdeb0c5,1,"archive_read_open");
  if (iVar3 == -0x1e) {
    _a_local._4_4_ = -0x1e;
  }
  else {
    archive_clear_error(_a);
    if (_a[1].error == (char *)0x0) {
      archive_set_error(_a,0x16,"No reader function provided to archive_read_open");
      _a->state = 0x8000;
      _a_local._4_4_ = -0x1e;
    }
    else {
      lVar1._0_4_ = _a[1].file_count;
      lVar1._4_4_ = _a[1].archive_error_number;
      if ((lVar1 == 0) ||
         (local_38 = (**(code **)&_a[1].file_count)
                               (_a,*(undefined8 *)(_a[1].read_data_block + 0x10)), local_38 == 0)) {
        pvVar4 = calloc(1,0x90);
        if (pvVar4 == (void *)0x0) {
          _a_local._4_4_ = -0x1e;
        }
        else {
          *(undefined8 *)((long)pvVar4 + 8) = 0;
          *(undefined8 *)((long)pvVar4 + 0x10) = 0;
          *(archive **)((long)pvVar4 + 0x18) = _a;
          *(undefined8 *)((long)pvVar4 + 0x28) = *(undefined8 *)(_a[1].read_data_block + 0x10);
          *(archive_read_filter_vtable **)((long)pvVar4 + 0x20) = &none_reader_vtable;
          *(char **)((long)pvVar4 + 0x30) = "none";
          *(undefined4 *)((long)pvVar4 + 0x38) = 0;
          *(undefined4 *)((long)pvVar4 + 0x3c) = 1;
          *(undefined4 *)((long)pvVar4 + 0x40) = 1;
          pcVar2 = _a[1].read_data_block;
          pcVar2[0] = '\0';
          pcVar2[1] = '\0';
          pcVar2[2] = '\0';
          pcVar2[3] = '\0';
          pcVar2[4] = '\0';
          pcVar2[5] = '\0';
          pcVar2[6] = '\0';
          pcVar2[7] = '\0';
          if ((_a[4].error_string.length == 0) || ((int)_a[4].error_string.buffer_length == 0)) {
            _a[4].error_string.length = (size_t)pvVar4;
            local_38 = choose_filters((archive_read *)_a);
            if (local_38 < -0x14) {
              _a->state = 0x8000;
              return -0x1e;
            }
          }
          else {
            for (_e = _a[4].error_string.length; *(long *)(_e + 0x10) != 0;
                _e = *(size_t *)(_e + 0x10)) {
            }
            *(void **)(_e + 0x10) = pvVar4;
          }
          if (_a[0xe].error_string.length == 0) {
            iVar3 = choose_format((archive_read *)_a);
            if (iVar3 < 0) {
              close_filters((archive_read *)_a);
              _a->state = 0x8000;
              return -0x1e;
            }
            _a[0xe].error_string.length = (size_t)(&_a[4].sconv + (long)iVar3 * 0xb);
          }
          _a->state = 2;
          client_switch_proxy((archive_read_filter *)_a[4].error_string.length,0);
          _a_local._4_4_ = local_38;
        }
      }
      else {
        read_client_close_proxy((archive_read *)_a);
        _a_local._4_4_ = local_38;
      }
    }
  }
  return _a_local._4_4_;
}

Assistant:

int
archive_read_open1(struct archive *_a)
{
	struct archive_read *a = (struct archive_read *)_a;
	struct archive_read_filter *filter, *tmp;
	int slot, e = ARCHIVE_OK;

	archive_check_magic(_a, ARCHIVE_READ_MAGIC, ARCHIVE_STATE_NEW,
	    "archive_read_open");
	archive_clear_error(&a->archive);

	if (a->client.reader == NULL) {
		archive_set_error(&a->archive, EINVAL,
		    "No reader function provided to archive_read_open");
		a->archive.state = ARCHIVE_STATE_FATAL;
		return (ARCHIVE_FATAL);
	}

	/* Open data source. */
	if (a->client.opener != NULL) {
		e = (a->client.opener)(&a->archive, a->client.dataset[0].data);
		if (e != 0) {
			/* If the open failed, call the closer to clean up. */
			read_client_close_proxy(a);
			return (e);
		}
	}

	filter = calloc(1, sizeof(*filter));
	if (filter == NULL)
		return (ARCHIVE_FATAL);
	filter->bidder = NULL;
	filter->upstream = NULL;
	filter->archive = a;
	filter->data = a->client.dataset[0].data;
	filter->vtable = &none_reader_vtable;
	filter->name = "none";
	filter->code = ARCHIVE_FILTER_NONE;
	filter->can_skip = 1;
	filter->can_seek = 1;

	a->client.dataset[0].begin_position = 0;
	if (!a->filter || !a->bypass_filter_bidding)
	{
		a->filter = filter;
		/* Build out the input pipeline. */
		e = choose_filters(a);
		if (e < ARCHIVE_WARN) {
			a->archive.state = ARCHIVE_STATE_FATAL;
			return (ARCHIVE_FATAL);
		}
	}
	else
	{
		/* Need to add "NONE" type filter at the end of the filter chain */
		tmp = a->filter;
		while (tmp->upstream)
			tmp = tmp->upstream;
		tmp->upstream = filter;
	}

	if (!a->format)
	{
		slot = choose_format(a);
		if (slot < 0) {
			close_filters(a);
			a->archive.state = ARCHIVE_STATE_FATAL;
			return (ARCHIVE_FATAL);
		}
		a->format = &(a->formats[slot]);
	}

	a->archive.state = ARCHIVE_STATE_HEADER;

	/* Ensure libarchive starts from the first node in a multivolume set */
	client_switch_proxy(a->filter, 0);
	return (e);
}